

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpOutputStream::queueWrite(HttpOutputStream *this,String *content)

{
  Promise<void> *dependencyParam;
  PromiseArena *pPVar1;
  _func_int **pp_Var2;
  PromiseArena *pPVar3;
  PromiseNode *pPVar4;
  PromiseArena *pPVar5;
  PromiseArenaMember *node;
  OwnPromiseNode node_00;
  void *pvVar6;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_78;
  HttpOutputStream *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  PromiseArena *local_58;
  PromiseNode *local_50;
  SourceLocation local_48;
  
  dependencyParam = &this->writeQueue;
  pPVar1 = (PromiseArena *)(content->content).ptr;
  pp_Var2 = (_func_int **)(content->content).size_;
  pPVar3 = (PromiseArena *)(content->content).disposer;
  (content->content).ptr = (char *)0x0;
  (content->content).size_ = 0;
  pPVar4 = (this->writeQueue).super_PromiseBase.node.ptr;
  pPVar5 = (pPVar4->super_PromiseArenaMember).arena;
  local_70 = this;
  local_58 = pPVar3;
  if (pPVar5 == (PromiseArena *)0x0 || (ulong)((long)pPVar4 - (long)pPVar5) < 0x40) {
    pvVar6 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2386:34)>
               ::anon_class_32_2_06e25726_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3c0) = &PTR_destroy_006d6e08;
    *(HttpOutputStream **)((long)pvVar6 + 0x3e0) = this;
    *(PromiseArena **)((long)pvVar6 + 1000) = pPVar1;
    *(_func_int ***)((long)pvVar6 + 0x3f0) = pp_Var2;
    *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar6 + 0x3c8) = pvVar6;
  }
  else {
    (pPVar4->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(pPVar4 + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2386:34)>
               ::anon_class_32_2_06e25726_for_func::operator());
    pPVar4[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006d6e08;
    pPVar4[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)this;
    pPVar4[-2].super_PromiseArenaMember.arena = pPVar1;
    pPVar4[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var2;
    pPVar4[-1].super_PromiseArenaMember.arena = pPVar3;
    pPVar4[-4].super_PromiseArenaMember.arena = pPVar5;
  }
  uStack_60 = 0;
  local_68 = 0;
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_78.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_78,&local_48);
  node_00.ptr = local_78.ptr;
  if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
  }
  node = &((dependencyParam->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
  (dependencyParam->super_PromiseBase).node.ptr = local_50;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  return;
}

Assistant:

void queueWrite(kj::String content) {
    // We only use queueWrite() in cases where we can take ownership of the write buffer, and where
    // it is convenient if we can return `void` rather than a promise.  In particular, this is used
    // to write headers and chunk boundaries. Writes of application data do not go into
    // `writeQueue` because this would prevent cancellation. Instead, they wait until `writeQueue`
    // is empty, then they make the write directly, using `writeInProgress` to detect and block
    // concurrent writes.

    writeQueue = writeQueue.then([this,content=kj::mv(content)]() mutable {
      auto promise = inner.write(content.asBytes());
      return promise.attach(kj::mv(content));
    });
  }